

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O0

wchar_t spell_color(player *p,monster_race *race,wchar_t spell_index)

{
  wchar_t wVar1;
  bool bVar2;
  _Bool _Var3;
  monster_spell *pmVar4;
  effect *local_48;
  effect *local_40;
  effect *eff;
  monster_spell_level *level;
  monster_spell *spell;
  wchar_t spell_index_local;
  monster_race *race_local;
  player *p_local;
  
  pmVar4 = monster_spell_by_index(spell_index);
  eff = (effect *)pmVar4->level;
  if (pmVar4 == (monster_spell *)0x0) {
    local_48 = (effect *)0x0;
  }
  else {
    local_48 = pmVar4->effect;
  }
  local_40 = local_48;
  if (pmVar4 == (monster_spell *)0x0) {
    p_local._4_4_ = L'\0';
  }
  else {
    while( true ) {
      bVar2 = false;
      if (eff->next != (effect *)0x0) {
        bVar2 = *(wchar_t *)&eff->next->index <= race->spell_power;
      }
      if (!bVar2) break;
      eff = eff->next;
    }
    if ((*(char *)((long)&eff->y + 1) == '\0') && (*(char *)((long)&eff->y + 2) == '\0')) {
      p_local._4_4_ = (wchar_t)(byte)eff->y;
    }
    else if (eff[1].next == (effect *)0x0) {
      if (((local_48->index == 0x4e) || (local_48->index == 0x45)) || (local_48->index == 0x46)) {
        wVar1 = local_48->subtype;
        if (wVar1 == L'\a') {
          if ((p->known_state).el_info[7].res_level < 1) {
            _Var3 = flag_has_dbg((p->known_state).flags,5,9,"p->known_state.flags","OF_PROT_STUN");
            if (_Var3) {
              p_local._4_4_ = (wchar_t)*(byte *)((long)&eff->y + 1);
            }
            else {
              p_local._4_4_ = (wchar_t)(byte)eff->y;
            }
          }
          else {
            p_local._4_4_ = (wchar_t)*(byte *)((long)&eff->y + 2);
          }
        }
        else if (wVar1 == L'\t') {
          if ((p->known_state).el_info[9].res_level < 1) {
            if ((p->known_state).skills[3] < 100) {
              p_local._4_4_ = (wchar_t)(byte)eff->y;
            }
            else {
              p_local._4_4_ = (wchar_t)*(byte *)((long)&eff->y + 1);
            }
          }
          else {
            p_local._4_4_ = (wchar_t)*(byte *)((long)&eff->y + 2);
          }
        }
        else if ((((uint)(wVar1 + L'\xfffffff3') < 2) || (wVar1 == L'\x11')) || (wVar1 == L'\x13'))
        {
          _Var3 = flag_has_dbg((p->known_state).flags,5,9,"p->known_state.flags","OF_PROT_STUN");
          if (_Var3) {
            _Var3 = flag_has_dbg((p->known_state).flags,5,8,"p->known_state.flags","OF_PROT_CONF");
            if ((_Var3) || (local_48->subtype != L'\r')) {
              p_local._4_4_ = (wchar_t)*(byte *)((long)&eff->y + 1);
            }
            else {
              p_local._4_4_ = (wchar_t)(byte)eff->y;
            }
          }
          else {
            p_local._4_4_ = (wchar_t)(byte)eff->y;
          }
        }
        else if ((p->known_state).el_info[local_48->subtype].res_level == 3) {
          p_local._4_4_ = (wchar_t)*(byte *)((long)&eff->y + 2);
        }
        else if ((p->known_state).el_info[local_48->subtype].res_level < 1) {
          p_local._4_4_ = (wchar_t)(byte)eff->y;
        }
        else {
          p_local._4_4_ = (wchar_t)*(byte *)((long)&eff->y + 1);
        }
      }
      else {
        p_local._4_4_ = (wchar_t)(byte)eff->y;
      }
    }
    else if ((p->known_state).skills[3] < 100) {
      if (local_48->index == 0x3a) {
        if ((p->known_state).el_info[9].res_level < 1) {
          p_local._4_4_ = (wchar_t)(byte)eff->y;
        }
        else {
          p_local._4_4_ = (wchar_t)*(byte *)((long)&eff->y + 1);
        }
      }
      else if (local_48->index == 10) {
        _Var3 = player_inc_check(p,local_48->subtype,true);
        if (_Var3) {
          p_local._4_4_ = (wchar_t)(byte)eff->y;
        }
        else {
          p_local._4_4_ = (wchar_t)*(byte *)((long)&eff->y + 1);
        }
      }
      else if (*(char *)((long)&eff->y + 2) == '\0') {
        p_local._4_4_ = (wchar_t)(byte)eff->y;
      }
      else {
        for (; local_40 != (effect *)0x0; local_40 = local_40->next) {
          if ((local_40->index == 10) && (_Var3 = player_inc_check(p,local_40->subtype,true), _Var3)
             ) {
            return (uint)(byte)eff->y;
          }
        }
        p_local._4_4_ = (wchar_t)*(byte *)((long)&eff->y + 1);
      }
    }
    else if (*(char *)((long)&eff->y + 2) == '\0') {
      p_local._4_4_ = (wchar_t)*(byte *)((long)&eff->y + 1);
    }
    else {
      p_local._4_4_ = (wchar_t)*(byte *)((long)&eff->y + 2);
    }
  }
  return p_local._4_4_;
}

Assistant:

static int spell_color(struct player *p, const struct monster_race *race,
					   int spell_index)
{
	const struct monster_spell *spell = monster_spell_by_index(spell_index);
	struct monster_spell_level *level = spell->level;
	struct effect *eff = spell ? spell->effect : NULL;

	/* No spell */
	if (!spell) return COLOUR_DARK;

	/* Get the right level */
	while (level->next && race->spell_power >= level->next->power) {
		level = level->next;
	}

	/* Unresistable spells just use the default color */
	if (!level->lore_attr_resist && !level->lore_attr_immune) {
		return level->lore_attr;
	}

	/* Spells with a save */
	if (level->save_message) {
		/* Mixed results if the save may fail, perfect result if it can't */
		if (p->known_state.skills[SKILL_SAVE] < 100) {
			if (eff->index == EF_TELEPORT_LEVEL) {
				/* Special case - teleport level */
				if (p->known_state.el_info[ELEM_NEXUS].res_level > 0) {
					return level->lore_attr_resist;
				} else {
					return level->lore_attr;
				}
			} else if (eff->index == EF_TIMED_INC) {
				/* Simple timed effects */
				if (player_inc_check(p, eff->subtype, true)) {
					return level->lore_attr;
				} else {
					return level->lore_attr_resist;
				}
			} else if (level->lore_attr_immune) {
				/* Multiple timed effects plus damage */
				for (; eff; eff = eff->next) {
					if (eff->index != EF_TIMED_INC) continue;
					if (player_inc_check(p, eff->subtype, true)) {
						return level->lore_attr;
					}
				}
				return level->lore_attr_resist;
			} else {
				/* Straight damage */
				return level->lore_attr;
			}
		} else if (level->lore_attr_immune) {
			return level->lore_attr_immune;
		} else {
			return level->lore_attr_resist;
		}
	}

	/* Bolts, balls and breaths */
	if ((eff->index == EF_BOLT) || (eff->index == EF_BALL) ||
		(eff->index == EF_BREATH)) {
		/* Treat by element */
		switch (eff->subtype) {
			/* Special case - sound */
			case ELEM_SOUND:
				if (p->known_state.el_info[ELEM_SOUND].res_level > 0) {
					return level->lore_attr_immune;
				} else if (of_has(p->known_state.flags, OF_PROT_STUN)) {
					return level->lore_attr_resist;
				} else {
					return level->lore_attr;
				}
				break;
			/* Special case - nexus */
			case ELEM_NEXUS:
				if (p->known_state.el_info[ELEM_NEXUS].res_level > 0) {
					return level->lore_attr_immune;
				} else if (p->known_state.skills[SKILL_SAVE] >= 100) {
					return level->lore_attr_resist;
				} else {
					return level->lore_attr;
				}
				break;
			/* Elements that stun or confuse */
			case ELEM_FORCE:
			case ELEM_ICE:
			case ELEM_PLASMA:
			case ELEM_WATER:
				if (!of_has(p->known_state.flags, OF_PROT_STUN)) {
					return level->lore_attr;
				} else if (!of_has(p->known_state.flags, OF_PROT_CONF) &&
						   (eff->subtype == ELEM_WATER)){
					return level->lore_attr;
				} else {
					return level->lore_attr_resist;
				}
				break;
			/* All other elements */
			default:
				if (p->known_state.el_info[eff->subtype].res_level == 3) {
					return level->lore_attr_immune;
				} else if (p->known_state.el_info[eff->subtype].res_level > 0) {
					return level->lore_attr_resist;
				} else {
					return level->lore_attr;
				}
		}
	}

	return level->lore_attr;
}